

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O0

int ssl_parse_alpn_ext(mbedtls_ssl_context *ssl,uchar *buf,size_t len)

{
  int iVar1;
  size_t sVar2;
  ulong __n;
  char **local_60;
  char **ours;
  uchar *end;
  uchar *start;
  uchar *theirs;
  size_t ours_len;
  size_t cur_len;
  size_t list_len;
  size_t len_local;
  uchar *buf_local;
  mbedtls_ssl_context *ssl_local;
  
  if (ssl->conf->alpn_list == (char **)0x0) {
    ssl_local._4_4_ = 0;
  }
  else if (len < 4) {
    ssl_local._4_4_ = -0x7900;
  }
  else if ((long)(int)(uint)CONCAT11(*buf,buf[1]) == len - 2) {
    for (local_60 = ssl->conf->alpn_list; *local_60 != (char *)0x0; local_60 = local_60 + 1) {
      sVar2 = strlen(*local_60);
      for (start = buf + 2; start != buf + len; start = start + 1 + __n) {
        if (buf + len < start) {
          return -0x7900;
        }
        __n = (ulong)*start;
        if (__n == 0) {
          return -0x7900;
        }
        if ((__n == sVar2) && (iVar1 = memcmp(start + 1,*local_60,__n), iVar1 == 0)) {
          ssl->alpn_chosen = *local_60;
          return 0;
        }
      }
    }
    mbedtls_ssl_send_alert_message(ssl,'\x02','x');
    ssl_local._4_4_ = -0x7900;
  }
  else {
    ssl_local._4_4_ = -0x7900;
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_parse_alpn_ext( mbedtls_ssl_context *ssl,
                               const unsigned char *buf, size_t len )
{
    size_t list_len, cur_len, ours_len;
    const unsigned char *theirs, *start, *end;
    const char **ours;

    /* If ALPN not configured, just ignore the extension */
    if( ssl->conf->alpn_list == NULL )
        return( 0 );

    /*
     * opaque ProtocolName<1..2^8-1>;
     *
     * struct {
     *     ProtocolName protocol_name_list<2..2^16-1>
     * } ProtocolNameList;
     */

    /* Min length is 2 (list_len) + 1 (name_len) + 1 (name) */
    if( len < 4 )
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO );

    list_len = ( buf[0] << 8 ) | buf[1];
    if( list_len != len - 2 )
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO );

    /*
     * Use our order of preference
     */
    start = buf + 2;
    end = buf + len;
    for( ours = ssl->conf->alpn_list; *ours != NULL; ours++ )
    {
        ours_len = strlen( *ours );
        for( theirs = start; theirs != end; theirs += cur_len )
        {
            /* If the list is well formed, we should get equality first */
            if( theirs > end )
                return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO );

            cur_len = *theirs++;

            /* Empty strings MUST NOT be included */
            if( cur_len == 0 )
                return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO );

            if( cur_len == ours_len &&
                memcmp( theirs, *ours, cur_len ) == 0 )
            {
                ssl->alpn_chosen = *ours;
                return( 0 );
            }
        }
    }

    /* If we get there, no match was found */
    mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                            MBEDTLS_SSL_ALERT_MSG_NO_APPLICATION_PROTOCOL );
    return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO );
}